

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O0

void lzma2_header_uncompressed(lzma_lzma2_coder_conflict *coder)

{
  lzma_lzma2_coder_conflict *coder_local;
  
  if (coder->uncompressed_size == 0) {
    __assert_fail("coder->uncompressed_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                  ,0x71,"void lzma2_header_uncompressed(lzma_lzma2_coder *)");
  }
  if (coder->uncompressed_size < 0x10001) {
    if ((coder->need_dictionary_reset & 1U) == 0) {
      coder->buf[0] = '\x02';
    }
    else {
      coder->buf[0] = '\x01';
    }
    coder->need_dictionary_reset = false;
    coder->buf[1] = (uint8_t)(coder->uncompressed_size - 1 >> 8);
    coder->buf[2] = (char)coder->uncompressed_size + 0xff;
    coder->buf_pos = 0;
    return;
  }
  __assert_fail("coder->uncompressed_size <= LZMA2_CHUNK_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                ,0x72,"void lzma2_header_uncompressed(lzma_lzma2_coder *)");
}

Assistant:

static void
lzma2_header_uncompressed(lzma_lzma2_coder *coder)
{
	assert(coder->uncompressed_size > 0);
	assert(coder->uncompressed_size <= LZMA2_CHUNK_MAX);

	// If this is the first chunk, we need to include dictionary
	// reset indicator.
	if (coder->need_dictionary_reset)
		coder->buf[0] = 1;
	else
		coder->buf[0] = 2;

	coder->need_dictionary_reset = false;

	// "Compressed" size
	coder->buf[1] = (coder->uncompressed_size - 1) >> 8;
	coder->buf[2] = (coder->uncompressed_size - 1) & 0xFF;

	// Set the start position for copying.
	coder->buf_pos = 0;
	return;
}